

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall Scene::~Scene(Scene *this)

{
  pointer ppMVar1;
  Mesh *pMVar2;
  Skybox *this_00;
  int i;
  ulong uVar3;
  
  operator_delete(this->camera);
  for (uVar3 = 0;
      ppMVar1 = (this->_childeren).super__Vector_base<Mesh_*,_std::allocator<Mesh_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->_childeren).super__Vector_base<Mesh_*,_std::allocator<Mesh_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pMVar2 = ppMVar1[uVar3];
    if (pMVar2 != (Mesh *)0x0) {
      Mesh::~Mesh(pMVar2);
    }
    operator_delete(pMVar2);
  }
  pMVar2 = this->_lamp;
  if (pMVar2 != (Mesh *)0x0) {
    Mesh::~Mesh(pMVar2);
    operator_delete(pMVar2);
  }
  this_00 = this->_skybox;
  if (this_00 != (Skybox *)0x0) {
    Skybox::~Skybox(this_00);
    operator_delete(this_00);
  }
  std::_Vector_base<Mesh_*,_std::allocator<Mesh_*>_>::~_Vector_base
            (&(this->_childeren).super__Vector_base<Mesh_*,_std::allocator<Mesh_*>_>);
  return;
}

Assistant:

Scene::~Scene() {
	delete this->camera;
	for (int i = 0; i < this->_childeren.size(); i++) {
		delete this->_childeren[i];
	}
	if (this->getLamp() != NULL) {
		delete this->getLamp();
	}
	if (this->getSkybox() != NULL) {
		delete this->getSkybox();
	}
}